

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sandbox.cpp
# Opt level: O3

void __thiscall
Sandbox::replayPoke(Sandbox *this,AccessType type,u32 addr,u64 cycle,u32 fc,u16 value)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  InstrInfo IVar5;
  
  if (this->enabled == true) {
    IVar5 = moira::Moira::getInstrInfo(&moiracpu->super_Moira,::opcode);
    if ((IVar5.S != 4 || IVar5.I != CLR) && ((IVar5.I != CHK || (cpuModel == M68000)))) {
      iVar1 = this->recordCnt;
      if (0 < (long)iVar1) {
        uVar2 = this->replayCnt;
        uVar3 = (ulong)uVar2;
        uVar4 = 0;
        do {
          if ((((uVar3 == uVar4) && (this->access[uVar3].type == type)) &&
              (this->access[uVar3].addr == addr)) &&
             ((this->access[uVar3].value == value && (this->access[uVar3].fc == fc)))) {
            this->replayCnt = uVar2 + 1;
            if ((int)uVar2 < iVar1) {
              return;
            }
            break;
          }
          uVar4 = uVar4 + 1;
        } while ((long)iVar1 != uVar4);
      }
      error(this,type,addr,cycle,fc,value);
      return;
    }
  }
  return;
}

Assistant:

void
Sandbox::replayPoke(AccessType type, u32 addr, u64 cycle, u32 fc, u16 value)
{
    if (!enabled) return;

    auto info = moiracpu->getInstrInfo(opcode);

    // Ignore some opcodes that are handled differently by Moira
    if (info.I == Instr::CLR && info.S == Long) return;
    if (info.I == Instr::CHK && cpuModel != Model::M68000) return;

    for (int i = 0; i < recordCnt; i++) {

        // Enable for strict checking
        if (i != replayCnt) continue;

        // Check for a matching entry
        if (access[i].type != type) continue;
        if (access[i].addr != addr) continue;
        if (access[i].value != value) continue;
        if (access[i].fc != fc) continue;
        if (!MOIRA_MIMIC_MUSASHI) {
            if (access[i].cycle != cycle) continue;
        }

        // Match found
        replayCnt++;
        if (replayCnt > recordCnt) { break; }
        return;
    }

    error(type, addr, cycle, fc, value);
}